

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,duration<long,_std::ratio<60L,_1L>_> *args)

{
  int iVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  if (*first == str) {
    if (operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                             ::oss_abi_cxx11_);
      }
    }
    local_38 = 0;
    local_30 = 0;
    local_40 = &local_30;
    std::__cxx11::stringbuf::str((string *)&DAT_0015e488);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
    std::ios::clear((int)*(undefined8 *)
                          (operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                           ::oss_abi_cxx11_ + -0x18) + 0x15e480);
    print_backend<std::__cxx11::ostringstream&,std::chrono::duration<long,std::ratio<60l,1l>>>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<std::chrono::duration<long,std::ratio<60l,1l>>>(ptc::mode&&,std::chrono::duration<long,std::ratio<long,long>>&&)
                     ::oss_abi_cxx11_,args);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_40,local_40 + local_38);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }